

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int archive_read_format_iso9660_read_header(archive_read *a,archive_entry *entry)

{
  long lVar1;
  int iVar2;
  wchar_t wVar3;
  mode_t mVar4;
  archive_string_conv *paVar5;
  void *pvVar6;
  int *piVar7;
  char *pcVar8;
  ulong uVar9;
  size_t n;
  archive_entry *in_RSI;
  archive *in_RDI;
  zisofs *zisofs;
  int64_t r64;
  int rd_r;
  int r;
  file_info *file;
  iso9660 *iso9660;
  archive_entry *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  wchar_t in_stack_ffffffffffffff84;
  file_info **in_stack_ffffffffffffff88;
  iso9660 *in_stack_ffffffffffffff90;
  archive_read *in_stack_ffffffffffffff98;
  iso9660 *in_stack_ffffffffffffffa0;
  archive_read *in_stack_ffffffffffffffa8;
  int local_30;
  int local_4;
  
  local_30 = 0;
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  if (in_RDI->archive_format == 0) {
    in_RDI->archive_format = 0x40000;
    in_RDI->archive_format_name = "ISO9660";
  }
  if (((*(long *)(lVar1 + 0xa0) != 0) ||
      (local_4 = choose_volume(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0), local_4 == 0))
     && (local_4 = next_entry_seek(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff88), local_4 == 0)) {
    if (*(char *)(lVar1 + 0x2a) == '\0') {
      *(undefined8 *)(lVar1 + 0x18) = 0;
      build_pathname((archive_string *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                     ,(file_info *)in_stack_ffffffffffffff78);
      archive_entry_set_pathname
                ((archive_entry *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (char *)in_stack_ffffffffffffff78);
    }
    else {
      if (*(long *)(lVar1 + 0x1e8) == 0) {
        paVar5 = archive_string_conversion_from_charset
                           ((archive *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                            in_stack_ffffffffffffff84);
        *(archive_string_conv **)(lVar1 + 0x1e8) = paVar5;
        if (*(long *)(lVar1 + 0x1e8) == 0) {
          return -0x1e;
        }
      }
      if (*(long *)(lVar1 + 0x1f0) == 0) {
        pvVar6 = malloc(0x400);
        *(void **)(lVar1 + 0x1f0) = pvVar6;
        if (*(long *)(lVar1 + 0x1f0) == 0) {
          archive_set_error(in_RDI,0xc,"No memory");
          return -0x1e;
        }
      }
      if (*(long *)(lVar1 + 0x200) == 0) {
        pvVar6 = malloc(0x400);
        *(void **)(lVar1 + 0x200) = pvVar6;
        if (*(long *)(lVar1 + 0x200) == 0) {
          archive_set_error(in_RDI,0xc,"No memory");
          return -0x1e;
        }
      }
      *(undefined8 *)(lVar1 + 0x1f8) = 0;
      iVar2 = build_pathname_utf16be
                        ((uchar *)in_stack_ffffffffffffff88,
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (size_t *)in_stack_ffffffffffffff78,(file_info *)0x13b7b4);
      if (iVar2 != 0) {
        archive_set_error(in_RDI,0x54,"Pathname is too long");
      }
      wVar3 = _archive_entry_copy_pathname_l
                        ((archive_entry *)in_stack_ffffffffffffff90,
                         (char *)in_stack_ffffffffffffff88,
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (archive_string_conv *)in_stack_ffffffffffffff78);
      if (wVar3 != L'\0') {
        piVar7 = __errno_location();
        if (*piVar7 == 0xc) {
          archive_set_error(in_RDI,0xc,"No memory for Pathname");
          return -0x1e;
        }
        pcVar8 = archive_string_conversion_charset_name(*(archive_string_conv **)(lVar1 + 0x1e8));
        archive_set_error(in_RDI,0x54,"Pathname cannot be converted from %s to current locale.",
                          pcVar8);
        local_30 = -0x14;
      }
    }
    *(long *)(lVar1 + 0xd8) = lRam0000000000000038;
    *(undefined8 *)(lVar1 + 0xd0) = 0;
    if (*(ulong *)(lVar1 + 0xb0) < uRam0000000000000030 + lRam0000000000000038) {
      pcVar8 = archive_entry_pathname(in_stack_ffffffffffffff78);
      archive_set_error(in_RDI,-1,"File is beyond end-of-media: %s",pcVar8);
      *(undefined8 *)(lVar1 + 0xd8) = 0;
      local_4 = -0x14;
    }
    else {
      archive_entry_set_mode(in_RSI,mRam0000000000000088);
      archive_entry_set_uid(in_RSI,(ulong)uRam000000000000008c);
      archive_entry_set_gid(in_RSI,(ulong)uRam0000000000000090);
      archive_entry_set_nlink(in_RSI,uRam00000000000000a0);
      if (iRam0000000000000058 == 0) {
        archive_entry_unset_birthtime((archive_entry *)0x13b9cd);
      }
      else {
        archive_entry_set_birthtime(in_RSI,tRam0000000000000060,0);
      }
      archive_entry_set_mtime(in_RSI,tRam0000000000000068,0);
      archive_entry_set_ctime(in_RSI,tRam0000000000000078,0);
      archive_entry_set_atime(in_RSI,tRam0000000000000070,0);
      archive_entry_set_rdev(in_RSI,dRam0000000000000080);
      archive_entry_set_size(in_RSI,*(int64_t *)(lVar1 + 0xd8));
      if (lRam00000000000000d8 != 0) {
        archive_entry_copy_symlink
                  ((archive_entry *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (char *)in_stack_ffffffffffffff78);
      }
      if ((lRam0000000000000098 == -1) || (lRam0000000000000098 != *(long *)(lVar1 + 0x48))) {
        if (((mRam0000000000000088 & 0xf000) != 0x4000) &&
           (uRam0000000000000030 < *(ulong *)(lVar1 + 0xa0))) {
          uVar9 = __archive_read_seek((archive_read *)
                                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                      (int64_t)in_stack_ffffffffffffff78,0);
          if (uVar9 != uRam0000000000000030) {
            archive_set_error(in_RDI,-1,"Ignoring out-of-order file @%jx (%s) %jd < %jd",
                              lRam0000000000000098,*(undefined8 *)(lVar1 + 0x10),
                              uRam0000000000000030,*(undefined8 *)(lVar1 + 0xa0));
            *(undefined8 *)(lVar1 + 0xd8) = 0;
            return -0x14;
          }
          *(ulong *)(lVar1 + 0xa0) = uVar9;
        }
        *(int *)(lVar1 + 0xe8) = iRam00000000000000f4;
        if (iRam00000000000000f4 != 0) {
          *(undefined4 *)(lVar1 + 0xf8) = 0;
          *(undefined4 *)(lVar1 + 0xec) = uRam00000000000000f8;
          *(int64_t *)(lVar1 + 0xf0) = iRam0000000000000100;
          *(undefined4 *)(lVar1 + 0x110) = 0;
          *(undefined8 *)(lVar1 + 0x128) = 0;
          *(undefined4 *)(lVar1 + 0x130) = 0;
          *(undefined8 *)(lVar1 + 0x150) = 0;
          archive_entry_set_size(in_RSI,iRam0000000000000100);
        }
        *(long *)(lVar1 + 0x48) = lRam0000000000000098;
        if (*(char *)(lVar1 + 0x2a) == '\0') {
          *(undefined8 *)(lVar1 + 0x58) = 0;
          n = lVar1 + 0x50;
          pvVar6 = *(void **)(lVar1 + 0x10);
          if (*(long *)(lVar1 + 0x10) != 0) {
            strlen(*(char **)(lVar1 + 0x10));
          }
          archive_strncat((archive_string *)in_stack_ffffffffffffffa0,pvVar6,n);
        }
        else {
          memcpy(*(void **)(lVar1 + 0x200),*(void **)(lVar1 + 0x1f0),*(size_t *)(lVar1 + 0x1f8));
          *(undefined8 *)(lVar1 + 0x208) = *(undefined8 *)(lVar1 + 0x1f8);
        }
        *(undefined8 *)(lVar1 + 0x1e0) = uRam0000000000000110;
        if (*(long *)(lVar1 + 0x1e0) != 0) {
          *(undefined8 *)(lVar1 + 0xd8) = *(undefined8 *)(*(long *)(lVar1 + 0x1e0) + 8);
        }
        mVar4 = archive_entry_filetype(in_RSI);
        if (mVar4 == 0x4000) {
          archive_entry_set_nlink(in_RSI,iRam0000000000000020 + 2);
          *(undefined8 *)(lVar1 + 0xd8) = 0;
        }
        if (local_30 == 0) {
          local_4 = 0;
        }
        else {
          local_4 = local_30;
        }
      }
      else {
        if (*(char *)(lVar1 + 0x2a) == '\0') {
          archive_entry_set_hardlink
                    ((archive_entry *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (char *)in_stack_ffffffffffffff78);
        }
        else {
          wVar3 = _archive_entry_copy_hardlink_l
                            ((archive_entry *)in_stack_ffffffffffffff90,
                             (char *)in_stack_ffffffffffffff88,
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             (archive_string_conv *)in_stack_ffffffffffffff78);
          if (wVar3 != L'\0') {
            piVar7 = __errno_location();
            if (*piVar7 == 0xc) {
              archive_set_error(in_RDI,0xc,"No memory for Linkname");
              return -0x1e;
            }
            pcVar8 = archive_string_conversion_charset_name
                               (*(archive_string_conv **)(lVar1 + 0x1e8));
            archive_set_error(in_RDI,0x54,"Linkname cannot be converted from %s to current locale.",
                              pcVar8);
            local_30 = -0x14;
          }
        }
        archive_entry_unset_size((archive_entry *)0x13bb68);
        *(undefined8 *)(lVar1 + 0xd8) = 0;
        local_4 = local_30;
      }
    }
  }
  return local_4;
}

Assistant:

static int
archive_read_format_iso9660_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct iso9660 *iso9660;
	struct file_info *file;
	int r, rd_r = ARCHIVE_OK;

	iso9660 = (struct iso9660 *)(a->format->data);

	if (!a->archive.archive_format) {
		a->archive.archive_format = ARCHIVE_FORMAT_ISO9660;
		a->archive.archive_format_name = "ISO9660";
	}

	if (iso9660->current_position == 0) {
		r = choose_volume(a, iso9660);
		if (r != ARCHIVE_OK)
			return (r);
	}

	file = NULL;/* Eliminate a warning. */
	/* Get the next entry that appears after the current offset. */
	r = next_entry_seek(a, iso9660, &file);
	if (r != ARCHIVE_OK)
		return (r);

	if (iso9660->seenJoliet) {
		/*
		 * Convert UTF-16BE of a filename to local locale MBS
		 * and store the result into a filename field.
		 */
		if (iso9660->sconv_utf16be == NULL) {
			iso9660->sconv_utf16be =
			    archive_string_conversion_from_charset(
				&(a->archive), "UTF-16BE", 1);
			if (iso9660->sconv_utf16be == NULL)
				/* Coundn't allocate memory */
				return (ARCHIVE_FATAL);
		}
		if (iso9660->utf16be_path == NULL) {
			iso9660->utf16be_path = malloc(UTF16_NAME_MAX);
			if (iso9660->utf16be_path == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
		}
		if (iso9660->utf16be_previous_path == NULL) {
			iso9660->utf16be_previous_path = malloc(UTF16_NAME_MAX);
			if (iso9660->utf16be_previous_path == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
		}

		iso9660->utf16be_path_len = 0;
		if (build_pathname_utf16be(iso9660->utf16be_path,
		    UTF16_NAME_MAX, &(iso9660->utf16be_path_len), file) != 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Pathname is too long");
		}

		r = archive_entry_copy_pathname_l(entry,
		    (const char *)iso9660->utf16be_path,
		    iso9660->utf16be_path_len,
		    iso9660->sconv_utf16be);
		if (r != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for Pathname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Pathname cannot be converted "
			    "from %s to current locale.",
			    archive_string_conversion_charset_name(
			      iso9660->sconv_utf16be));

			rd_r = ARCHIVE_WARN;
		}
	} else {
		archive_string_empty(&iso9660->pathname);
		archive_entry_set_pathname(entry,
		    build_pathname(&iso9660->pathname, file));
	}

	iso9660->entry_bytes_remaining = file->size;
	/* Offset for sparse-file-aware clients. */
	iso9660->entry_sparse_offset = 0;

	if (file->offset + file->size > iso9660->volume_size) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "File is beyond end-of-media: %s",
		    archive_entry_pathname(entry));
		iso9660->entry_bytes_remaining = 0;
		return (ARCHIVE_WARN);
	}

	/* Set up the entry structure with information about this entry. */
	archive_entry_set_mode(entry, file->mode);
	archive_entry_set_uid(entry, file->uid);
	archive_entry_set_gid(entry, file->gid);
	archive_entry_set_nlink(entry, file->nlinks);
	if (file->birthtime_is_set)
		archive_entry_set_birthtime(entry, file->birthtime, 0);
	else
		archive_entry_unset_birthtime(entry);
	archive_entry_set_mtime(entry, file->mtime, 0);
	archive_entry_set_ctime(entry, file->ctime, 0);
	archive_entry_set_atime(entry, file->atime, 0);
	/* N.B.: Rock Ridge supports 64-bit device numbers. */
	archive_entry_set_rdev(entry, (dev_t)file->rdev);
	archive_entry_set_size(entry, iso9660->entry_bytes_remaining);
	if (file->symlink.s != NULL)
		archive_entry_copy_symlink(entry, file->symlink.s);

	/* Note: If the input isn't seekable, we can't rewind to
	 * return the same body again, so if the next entry refers to
	 * the same data, we have to return it as a hardlink to the
	 * original entry. */
	if (file->number != -1 &&
	    file->number == iso9660->previous_number) {
		if (iso9660->seenJoliet) {
			r = archive_entry_copy_hardlink_l(entry,
			    (const char *)iso9660->utf16be_previous_path,
			    iso9660->utf16be_previous_path_len,
			    iso9660->sconv_utf16be);
			if (r != 0) {
				if (errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "No memory for Linkname");
					return (ARCHIVE_FATAL);
				}
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Linkname cannot be converted "
				    "from %s to current locale.",
				    archive_string_conversion_charset_name(
				      iso9660->sconv_utf16be));
				rd_r = ARCHIVE_WARN;
			}
		} else
			archive_entry_set_hardlink(entry,
			    iso9660->previous_pathname.s);
		archive_entry_unset_size(entry);
		iso9660->entry_bytes_remaining = 0;
		return (rd_r);
	}

	if ((file->mode & AE_IFMT) != AE_IFDIR &&
	    file->offset < iso9660->current_position) {
		int64_t r64;

		r64 = __archive_read_seek(a, file->offset, SEEK_SET);
		if (r64 != (int64_t)file->offset) {
			/* We can't seek backwards to extract it, so issue
			 * a warning.  Note that this can only happen if
			 * this entry was added to the heap after we passed
			 * this offset, that is, only if the directory
			 * mentioning this entry is later than the body of
			 * the entry. Such layouts are very unusual; most
			 * ISO9660 writers lay out and record all directory
			 * information first, then store all file bodies. */
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Ignoring out-of-order file @%jx (%s) %jd < %jd",
			    (intmax_t)file->number,
			    iso9660->pathname.s,
			    (intmax_t)file->offset,
			    (intmax_t)iso9660->current_position);
			iso9660->entry_bytes_remaining = 0;
			return (ARCHIVE_WARN);
		}
		iso9660->current_position = (uint64_t)r64;
	}

	/* Initialize zisofs variables. */
	iso9660->entry_zisofs.pz = file->pz;
	if (file->pz) {
#ifdef HAVE_ZLIB_H
		struct zisofs  *zisofs;

		zisofs = &iso9660->entry_zisofs;
		zisofs->initialized = 0;
		zisofs->pz_log2_bs = file->pz_log2_bs;
		zisofs->pz_uncompressed_size = file->pz_uncompressed_size;
		zisofs->pz_offset = 0;
		zisofs->header_avail = 0;
		zisofs->header_passed = 0;
		zisofs->block_pointers_avail = 0;
#endif
		archive_entry_set_size(entry, file->pz_uncompressed_size);
	}

	iso9660->previous_number = file->number;
	if (iso9660->seenJoliet) {
		memcpy(iso9660->utf16be_previous_path, iso9660->utf16be_path,
		    iso9660->utf16be_path_len);
		iso9660->utf16be_previous_path_len = iso9660->utf16be_path_len;
	} else
		archive_strcpy(
		    &iso9660->previous_pathname, iso9660->pathname.s);

	/* Reset entry_bytes_remaining if the file is multi extent. */
	iso9660->entry_content = file->contents.first;
	if (iso9660->entry_content != NULL)
		iso9660->entry_bytes_remaining = iso9660->entry_content->size;

	if (archive_entry_filetype(entry) == AE_IFDIR) {
		/* Overwrite nlinks by proper link number which is
		 * calculated from number of sub directories. */
		archive_entry_set_nlink(entry, 2 + file->subdirs);
		/* Directory data has been read completely. */
		iso9660->entry_bytes_remaining = 0;
	}

	if (rd_r != ARCHIVE_OK)
		return (rd_r);
	return (ARCHIVE_OK);
}